

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorRegressor::SerializeWithCachedSizes
          (SupportVectorRegressor *this,CodedOutputStream *output)

{
  double value;
  uint32 uVar1;
  
  if (this->kernel_ != (Kernel *)0x0 &&
      this != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->kernel_->super_MessageLite,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  if (this->coefficients_ != (Coefficients *)0x0 &&
      this != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->coefficients_->super_MessageLite,output);
  }
  value = this->rho_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(5,value,output);
  return;
}

Assistant:

void SupportVectorRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SupportVectorRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->kernel_, output);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
  if (has_sparsesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *supportVectors_.sparsesupportvectors_, output);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
  if (has_densesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *supportVectors_.densesupportvectors_, output);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->has_coefficients()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->coefficients_, output);
  }

  // double rho = 5;
  if (this->rho() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(5, this->rho(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SupportVectorRegressor)
}